

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_SetReportIgnoresFalse_Test::
TestBody(MessageDifferencerTest_IgnoreField_SetReportIgnoresFalse_Test *this)

{
  pointer pcVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  pointer *__ptr;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  AssertionResult gtest_ar_;
  FieldDescriptor *rc;
  FieldDescriptor *c;
  AssertionResult gtest_ar;
  FieldDescriptor *b;
  FieldDescriptor *a;
  string diff_report;
  TestField msg1;
  MessageDifferencer differencer;
  TestField msg2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_310;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_308;
  Message local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  AssertHelper local_2e0;
  FieldDescriptor *local_2d8;
  FieldDescriptor *local_2d0;
  undefined1 local_2c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  FieldDescriptor *local_2a8;
  FieldDescriptor *local_2a0;
  string local_298;
  undefined1 local_278 [88];
  undefined1 local_220 [380];
  bool local_a4;
  bool local_a2;
  TestField local_70;
  
  proto2_unittest::TestField::TestField((TestField *)local_278,(Arena *)0x0);
  proto2_unittest::TestField::TestField(&local_70,(Arena *)0x0);
  local_278._80_4_ = 2;
  local_278._72_8_ = &DAT_100000003;
  local_278[0x10] = local_278[0x10] | 0xe;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x18),1);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x18),2);
  local_70.field_0._60_8_ = &DAT_100000001;
  local_70.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_70.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xc;
  pcVar1 = local_220 + 0x10;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"a","");
  local_2a0 = GetFieldDescriptor((Message *)local_278,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"b","");
  local_2a8 = GetFieldDescriptor((Message *)local_278,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"c","");
  local_2d0 = GetFieldDescriptor((Message *)local_278,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"rc","");
  local_2d8 = GetFieldDescriptor((Message *)local_278,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_308.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (FieldDescriptor **)0x0;
  local_308.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (FieldDescriptor **)0x0;
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_308,(iterator)0x0,&local_2a0);
  if (local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_308,
               (iterator)
               local_308.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2a8);
  }
  else {
    *local_308.
     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_2a8;
    local_308.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_308.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_308,
               (iterator)
               local_308.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2d0);
  }
  else {
    *local_308.
     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_2d0;
    local_308.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_308.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&local_308,
               (iterator)
               local_308.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_2d8);
  }
  else {
    *local_308.
     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_2d8;
    local_308.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_308.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_220);
  local_a2 = false;
  local_a4 = true;
  util::MessageDifferencer::ReportDifferencesToString((MessageDifferencer *)local_220,&local_298);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_220,local_2d0);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_220,local_2d8);
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_220,FULL);
  bVar2 = util::MessageDifferencer::CompareWithFields
                    ((MessageDifferencer *)local_220,(Message *)local_278,&local_70.super_Message,
                     &local_308,&local_308);
  local_2f0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar2;
  local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2c8,(internal *)&local_2f0,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb33,(char *)CONCAT71(local_2c8._1_7_,local_2c8[0]));
    testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2c8._1_7_,local_2c8[0]) != &local_2b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2c8._1_7_,local_2c8[0]),local_2b8._M_allocated_capacity + 1)
      ;
    }
    if (local_310._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_310._M_head_impl + 8))();
    }
  }
  if (local_2e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2e8,local_2e8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[36]>
            ((internal *)local_2c8,"diff_report","\"matched: a : 1\\n\" \"modified: b: 2 -> 1\\n\"",
             &local_298,(char (*) [36])"matched: a : 1\nmodified: b: 2 -> 1\n");
  if (local_2c8[0] == (internal)0x0) {
    testing::Message::Message(&local_2f0);
    if (local_2c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_2c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb37,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_310,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_310);
    if ((long *)CONCAT71(local_2f0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_2f0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_2f0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_2f0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_2c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2c0,local_2c0);
  }
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  if (local_308.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  proto2_unittest::TestField::~TestField(&local_70);
  proto2_unittest::TestField::~TestField((TestField *)local_278);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_SetReportIgnoresFalse) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_a(1);
  msg1.set_b(2);
  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_a(1);
  msg2.set_b(1);

  const FieldDescriptor* a = GetFieldDescriptor(msg1, "a");
  const FieldDescriptor* b = GetFieldDescriptor(msg1, "b");
  const FieldDescriptor* c = GetFieldDescriptor(msg1, "c");
  const FieldDescriptor* rc = GetFieldDescriptor(msg1, "rc");

  std::vector<const FieldDescriptor*> fields;
  fields.push_back(a);
  fields.push_back(b);
  fields.push_back(c);
  fields.push_back(rc);

  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.set_report_ignores(false);
  differencer.set_report_matches(true);
  differencer.ReportDifferencesToString(&diff_report);
  differencer.IgnoreField(c);
  differencer.IgnoreField(rc);
  differencer.set_scope(util::MessageDifferencer::FULL);
  EXPECT_FALSE(differencer.CompareWithFields(msg1, msg2, fields, fields));

  EXPECT_EQ(diff_report,
            "matched: a : 1\n"
            "modified: b: 2 -> 1\n");
}